

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribe_options.h
# Opt level: O0

void __thiscall
miniros::SubscribeOptions::init<std_msgs::Empty_<std::allocator<void>>>
          (SubscribeOptions *this,string *_topic,uint32_t _queue_size,
          function<void_(const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&)>
          *_callback,
          function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>_>_>_()> *factory_fn)

{
  char *pcVar1;
  function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>_>_>_()> *in_RCX;
  undefined4 in_EDX;
  string *in_RSI;
  string *in_RDI;
  shared_ptr<miniros::SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = in_EDX;
  pcVar1 = message_traits::md5sum<std_msgs::Empty_<std::allocator<void>>>();
  std::__cxx11::string::operator=(in_RDI + 0x28,pcVar1);
  pcVar1 = message_traits::datatype<std_msgs::Empty_<std::allocator<void>>>();
  std::__cxx11::string::operator=(in_RDI + 0x48,pcVar1);
  std::
  make_shared<miniros::SubscriptionCallbackHelperT<std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>const&,void>,std::function<void(std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>const&)>const&,std::function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>>>()>const&>
            ((function<void_(const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&)>
              *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX);
  std::shared_ptr<miniros::SubscriptionCallbackHelper>::operator=
            ((shared_ptr<miniros::SubscriptionCallbackHelper> *)in_RDI,in_stack_ffffffffffffffb8);
  std::
  shared_ptr<miniros::SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>_>
  ::~shared_ptr((shared_ptr<miniros::SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>_>
                 *)0x1de619);
  return;
}

Assistant:

void init(const std::string& _topic, uint32_t _queue_size,
       const std::function<void (const std::shared_ptr<M const>&)>& _callback,
       const std::function<std::shared_ptr<M>(void)>& factory_fn = DefaultMessageCreator<M>())
  {
    typedef typename ParameterAdapter<M>::Message MessageType;
    topic = _topic;
    queue_size = _queue_size;
    md5sum = message_traits::md5sum<MessageType>();
    datatype = message_traits::datatype<MessageType>();
    helper = std::make_shared<SubscriptionCallbackHelperT<const std::shared_ptr<MessageType const>&> >(_callback, factory_fn);
  }